

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

bool __thiscall
google::protobuf::Reflection::DeleteMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key)

{
  bool bVar1;
  MapFieldBase *this_00;
  
  if (field->type_ == '\v') {
    bVar1 = FieldDescriptor::is_map_message_type(field);
    if (bVar1) {
      VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
      this_00 = (MapFieldBase *)MutableRawImpl(this,message,field);
      bVar1 = protobuf::internal::MapFieldBase::DeleteMapValue(this_00,key);
      return bVar1;
    }
  }
  anon_unknown_6::ReportReflectionUsageError
            (this->descriptor_,field,"DeleteMapValue","Field is not a map field.");
}

Assistant:

bool Reflection::DeleteMapValue(Message* message, const FieldDescriptor* field,
                                const MapKey& key) const {
  USAGE_CHECK(IsMapFieldInApi(field), DeleteMapValue,
              "Field is not a map field.");
  return MutableRaw<MapFieldBase>(message, field)->DeleteMapValue(key);
}